

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::ColumnMetaData::ColumnMetaData(ColumnMetaData *this)

{
  _SizeStatistics__isset *p_Var1;
  
  *(undefined ***)this = &PTR__ColumnMetaData_027d6ba0;
  this->type = BOOLEAN;
  (this->encodings).
  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>.
  super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->encodings).
  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>.
  super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->encodings).
  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>.
  super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->path_in_schema).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this->codec = UNCOMPRESSED;
  (this->path_in_schema).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_in_schema).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->num_values = 0;
  this->total_uncompressed_size = 0;
  this->total_compressed_size = 0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->data_page_offset = 0;
  this->index_page_offset = 0;
  this->dictionary_page_offset = 0;
  Statistics::Statistics(&this->statistics);
  (this->encoding_stats).
  super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  .
  super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bloom_filter_offset = 0;
  (this->encoding_stats).
  super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  .
  super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->encoding_stats).
  super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  .
  super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->bloom_filter_length = 0;
  *(undefined ***)&this->size_statistics = &PTR__SizeStatistics_027d5c98;
  (this->size_statistics).unencoded_byte_array_data_bytes = 0;
  (this->size_statistics).repetition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->size_statistics).repetition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->size_statistics).repetition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (this->size_statistics).definition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->size_statistics).definition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->size_statistics).definition_level_histogram.super_vector<long,_std::allocator<long>_>.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  p_Var1 = &(this->size_statistics).__isset;
  *p_Var1 = (_SizeStatistics__isset)((byte)*p_Var1 & 0xf8);
  this->__isset = (_ColumnMetaData__isset)0x0;
  return;
}

Assistant:

ColumnMetaData::ColumnMetaData() noexcept
   : type(static_cast<Type::type>(0)),
     codec(static_cast<CompressionCodec::type>(0)),
     num_values(0),
     total_uncompressed_size(0),
     total_compressed_size(0),
     data_page_offset(0),
     index_page_offset(0),
     dictionary_page_offset(0),
     bloom_filter_offset(0),
     bloom_filter_length(0) {
}